

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

int archive_compressor_compress_open(archive_write_filter *f)

{
  size_t sVar1;
  int iVar2;
  undefined8 *__ptr;
  ulong uVar3;
  void *pvVar4;
  size_t bpb;
  size_t bs;
  private_data_conflict4 *state;
  archive_write_filter *f_local;
  
  bpb = 0x10000;
  f->code = 3;
  f->name = "compress";
  __ptr = (undefined8 *)calloc(1,0x65190);
  if (__ptr == (undefined8 *)0x0) {
    archive_set_error(f->archive,0xc,"Can\'t allocate data for compression");
    f_local._4_4_ = -0x1e;
  }
  else {
    sVar1 = bpb;
    if (f->archive->magic == 0xb0c5c0de) {
      iVar2 = archive_write_get_bytes_per_block(f->archive);
      uVar3 = (ulong)iVar2;
      sVar1 = uVar3;
      if ((uVar3 < 0x10001) && (sVar1 = bpb, uVar3 != 0)) {
        sVar1 = 0x10000 - 0x10000U % uVar3;
      }
    }
    bpb = sVar1;
    __ptr[0xca30] = bpb;
    pvVar4 = malloc(__ptr[0xca30]);
    __ptr[0xca2f] = pvVar4;
    if (__ptr[0xca2f] == 0) {
      archive_set_error(f->archive,0xc,"Can\'t allocate data for compression buffer");
      free(__ptr);
      f_local._4_4_ = -0x1e;
    }
    else {
      f->write = archive_compressor_compress_write;
      f->close = archive_compressor_compress_close;
      f->free = archive_compressor_compress_free;
      *(undefined4 *)(__ptr + 4) = 0x10000;
      *__ptr = 0;
      *(undefined1 *)(__ptr + 0xca2e) = 0;
      *(undefined4 *)((long)__ptr + 0x6516c) = 0;
      __ptr[1] = 3;
      *(undefined4 *)(__ptr + 0xca2c) = 0;
      __ptr[2] = 10000;
      *(undefined4 *)(__ptr + 3) = 9;
      *(int *)((long)__ptr + 0x1c) = (1 << ((byte)*(undefined4 *)(__ptr + 3) & 0x1f)) + -1;
      *(undefined4 *)((long)__ptr + 0x6515c) = 0x101;
      memset((void *)((long)__ptr + 0x24),0xff,0x43624);
      *(undefined1 *)__ptr[0xca2f] = 0x1f;
      *(undefined1 *)(__ptr[0xca2f] + 1) = 0x9d;
      *(undefined1 *)(__ptr[0xca2f] + 2) = 0x90;
      __ptr[0xca31] = 3;
      f->data = __ptr;
      f_local._4_4_ = 0;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_compress_open(struct archive_write_filter *f)
{
	struct private_data *state;
	size_t bs = 65536, bpb;

	f->code = ARCHIVE_FILTER_COMPRESS;
	f->name = "compress";

	state = calloc(1, sizeof(*state));
	if (state == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for compression");
		return (ARCHIVE_FATAL);
	}

	if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
		/* Buffer size should be a multiple number of the bytes
		 * per block for performance. */
		bpb = archive_write_get_bytes_per_block(f->archive);
		if (bpb > bs)
			bs = bpb;
		else if (bpb != 0)
			bs -= bs % bpb;
	}
	state->compressed_buffer_size = bs;
	state->compressed = malloc(state->compressed_buffer_size);

	if (state->compressed == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for compression buffer");
		free(state);
		return (ARCHIVE_FATAL);
	}

	f->write = archive_compressor_compress_write;
	f->close = archive_compressor_compress_close;
	f->free = archive_compressor_compress_free;

	state->max_maxcode = 0x10000;	/* Should NEVER generate this code. */
	state->in_count = 0;		/* Length of input. */
	state->bit_buf = 0;
	state->bit_offset = 0;
	state->out_count = 3;		/* Includes 3-byte header mojo. */
	state->compress_ratio = 0;
	state->checkpoint = CHECK_GAP;
	state->code_len = 9;
	state->cur_maxcode = MAXCODE(state->code_len);
	state->first_free = FIRST;

	memset(state->hashtab, 0xff, sizeof(state->hashtab));

	/* Prime output buffer with a gzip header. */
	state->compressed[0] = 0x1f; /* Compress */
	state->compressed[1] = 0x9d;
	state->compressed[2] = 0x90; /* Block mode, 16bit max */
	state->compressed_offset = 3;

	f->data = state;
	return (0);
}